

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.cpp
# Opt level: O2

char * Diligent::GetFramebufferStatusString(GLenum Status)

{
  switch(Status) {
  case 0x8cd5:
    return "GL_FRAMEBUFFER_COMPLETE";
  case 0x8cd6:
    return "GL_FRAMEBUFFER_INCOMPLETE_ATTACHMENT";
  case 0x8cd7:
    return "GL_FRAMEBUFFER_INCOMPLETE_MISSING_ATTACHMENT";
  case 0x8cd8:
  case 0x8cd9:
  case 0x8cda:
    goto switchD_00316771_caseD_8cd8;
  case 0x8cdb:
    return "GL_FRAMEBUFFER_INCOMPLETE_DRAW_BUFFER";
  case 0x8cdc:
    return "GL_FRAMEBUFFER_INCOMPLETE_READ_BUFFER";
  case 0x8cdd:
    return "GL_FRAMEBUFFER_UNSUPPORTED";
  default:
    if (Status == 0x8d56) {
      return "GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE";
    }
    if (Status == 0x8da8) {
      return "GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS";
    }
switchD_00316771_caseD_8cd8:
    return "UNKNOWN";
  }
}

Assistant:

const char* GetFramebufferStatusString(GLenum Status)
{
    switch (Status)
    {
        // clang-format off
        case GL_FRAMEBUFFER_COMPLETE:                      return "GL_FRAMEBUFFER_COMPLETE";
        case GL_FRAMEBUFFER_INCOMPLETE_ATTACHMENT:         return "GL_FRAMEBUFFER_INCOMPLETE_ATTACHMENT";
        case GL_FRAMEBUFFER_INCOMPLETE_MISSING_ATTACHMENT: return "GL_FRAMEBUFFER_INCOMPLETE_MISSING_ATTACHMENT";
        case GL_FRAMEBUFFER_INCOMPLETE_DRAW_BUFFER:        return "GL_FRAMEBUFFER_INCOMPLETE_DRAW_BUFFER";
        case GL_FRAMEBUFFER_INCOMPLETE_READ_BUFFER:        return "GL_FRAMEBUFFER_INCOMPLETE_READ_BUFFER";
        case GL_FRAMEBUFFER_UNSUPPORTED:                   return "GL_FRAMEBUFFER_UNSUPPORTED";
        case GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE:        return "GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE";
        case GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS:      return "GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS";
        // clang-format on
        default:
            return "UNKNOWN";
    }
}